

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

int cuddGarbageCollect(DdManager *unique,int clearCache)

{
  uint *puVar1;
  int *piVar2;
  DdCache *pDVar3;
  DdHook *pDVar4;
  DdManager *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  abctime aVar8;
  ulong uVar9;
  ulong uVar10;
  abctime aVar11;
  long lVar12;
  DdSubtable *extraout_RDX;
  DdSubtable *extraout_RDX_00;
  DdSubtable *caller;
  DdNode *pDVar13;
  DdSubtable *extraout_RDX_01;
  DdSubtable *extraout_RDX_02;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  DdSubtable *pDVar17;
  uint uVar18;
  DdNode **ppDVar19;
  DdNode *pDVar20;
  ulong uVar21;
  DdNode **ppDVar22;
  DdManager *pDVar23;
  uint uVar24;
  DdHook **ppDVar25;
  bool bVar26;
  
  pDVar3 = unique->cache;
  cuddClearDeathRow(unique);
  ppDVar25 = &unique->preGCHook;
  while (pDVar4 = *ppDVar25, pDVar4 != (DdHook *)0x0) {
    iVar7 = (*pDVar4->f)(unique,"DD",(void *)0x0);
    ppDVar25 = &pDVar4->next;
    if (iVar7 == 0) {
      return 0;
    }
  }
  if (unique->dead + unique->deadZ == 0) {
    ppDVar25 = &unique->postGCHook;
    do {
      pDVar4 = *ppDVar25;
      if (pDVar4 == (DdHook *)0x0) {
        return 0;
      }
      iVar7 = (*pDVar4->f)(unique,"DD",(void *)0x0);
      ppDVar25 = &pDVar4->next;
    } while (iVar7 != 0);
    return 0;
  }
  if ((((clearCache != 0) && (unique->gcFrac == 1.0)) && (!NAN(unique->gcFrac))) &&
     ((unique->slots <= unique->looseUpTo && (unique->stash != (char *)0x0)))) {
    unique->minDead = unique->slots << 2;
    unique->gcFrac = 4.0;
    return 0;
  }
  uVar10 = 0;
  aVar8 = Extra_CpuTime();
  unique->garbageCollections = unique->garbageCollections + 1;
  caller = extraout_RDX;
  if (clearCache != 0) {
    uVar9 = (ulong)unique->cacheSlots;
    if ((int)unique->cacheSlots < 1) {
      uVar9 = uVar10;
    }
    for (lVar12 = 0; uVar9 * 0x28 - lVar12 != 0; lVar12 = lVar12 + 0x28) {
      uVar16 = *(ulong *)((long)&pDVar3->data + lVar12);
      if ((uVar16 != 0) &&
         ((((uVar21 = *(ulong *)((long)&pDVar3->f + lVar12),
            *(int *)((uVar21 & 0xfffffffffffffff0) + 4) == 0 ||
            (*(int *)((*(ulong *)((long)&pDVar3->g + lVar12) & 0xfffffffffffffff0) + 4) == 0)) ||
           (((uVar21 & 2) != 0 &&
            (*(int *)((*(ulong *)((long)&pDVar3->h + lVar12) & 0xfffffffffffffffe) + 4) == 0)))) ||
          ((uVar16 != 1 && (*(int *)((uVar16 & 0xfffffffffffffffe) + 4) == 0)))))) {
        *(undefined8 *)((long)&pDVar3->data + lVar12) = 0;
        unique->cachedeletions = unique->cachedeletions + 1.0;
      }
    }
    cuddLocalCacheClearDead(unique);
    caller = extraout_RDX_00;
  }
  uVar9 = (ulong)(uint)unique->size;
  if (unique->size < 1) {
    uVar9 = uVar10;
  }
  for (uVar16 = 0; uVar24 = (uint)uVar10, uVar16 != uVar9; uVar16 = uVar16 + 1) {
    caller = unique->subtables;
    if (caller[uVar16].dead != 0) {
      ppDVar22 = caller[uVar16].nodelist;
      uVar15 = caller[uVar16].slots;
      uVar21 = 0;
      uVar10 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar10 = uVar21;
      }
      caller = (DdSubtable *)0x0;
      for (; uVar21 != uVar10; uVar21 = uVar21 + 1) {
        ppDVar19 = ppDVar22 + uVar21;
        pDVar23 = (DdManager *)*ppDVar19;
        while (pDVar23 != unique) {
          pDVar5 = (DdManager *)(pDVar23->sentinel).next;
          if ((pDVar23->sentinel).ref == 0) {
            caller = (DdSubtable *)(ulong)((int)caller + 1);
            pDVar23 = pDVar5;
          }
          else {
            *ppDVar19 = &pDVar23->sentinel;
            ppDVar19 = &(pDVar23->sentinel).next;
            pDVar23 = pDVar5;
          }
        }
        *ppDVar19 = &unique->sentinel;
      }
      pDVar17 = unique->subtables;
      uVar15 = (uint)caller;
      if (uVar15 != pDVar17[uVar16].dead) goto LAB_0066036f;
      pDVar17[uVar16].keys = pDVar17[uVar16].keys - uVar15;
      uVar10 = (ulong)(uVar24 + uVar15);
      pDVar17[uVar16].dead = 0;
    }
  }
  uVar15 = (unique->constants).dead;
  if (uVar15 != 0) {
    ppDVar22 = (unique->constants).nodelist;
    uVar18 = (unique->constants).slots;
    pDVar17 = (DdSubtable *)0x0;
    caller = (DdSubtable *)(ulong)uVar18;
    if ((int)uVar18 < 1) {
      caller = pDVar17;
    }
    uVar18 = 0;
    for (; pDVar17 != caller; pDVar17 = (DdSubtable *)((long)&pDVar17->nodelist + 1)) {
      ppDVar19 = ppDVar22 + (long)pDVar17;
      pDVar13 = *ppDVar19;
      while (pDVar13 != (DdNode *)0x0) {
        pDVar6 = pDVar13->next;
        if (pDVar13->ref == 0) {
          uVar18 = uVar18 + 1;
          pDVar13 = pDVar6;
        }
        else {
          *ppDVar19 = pDVar13;
          ppDVar19 = &pDVar13->next;
          pDVar13 = pDVar6;
        }
      }
      *ppDVar19 = (DdNode *)0x0;
    }
    if (uVar18 != uVar15) goto LAB_00660382;
    puVar1 = &(unique->constants).keys;
    *puVar1 = *puVar1 - uVar15;
    uVar24 = uVar24 + uVar15;
    (unique->constants).dead = 0;
  }
  if (uVar24 == unique->dead) {
    unique->keys = unique->keys - uVar24;
    unique->dead = 0;
    uVar16 = 0;
    uVar10 = (ulong)(uint)unique->sizeZ;
    if (unique->sizeZ < 1) {
      uVar10 = uVar16;
    }
    uVar15 = 0;
    for (; uVar16 != uVar10; uVar16 = uVar16 + 1) {
      caller = unique->subtableZ;
      if (caller[uVar16].dead != 0) {
        ppDVar22 = caller[uVar16].nodelist;
        uVar18 = caller[uVar16].slots;
        uVar21 = 0;
        uVar9 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar9 = uVar21;
        }
        caller = (DdSubtable *)0x0;
        for (; uVar21 != uVar9; uVar21 = uVar21 + 1) {
          ppDVar19 = ppDVar22 + uVar21;
          pDVar13 = *ppDVar19;
          while (pDVar13 != (DdNode *)0x0) {
            pDVar6 = pDVar13->next;
            if (pDVar13->ref == 0) {
              caller = (DdSubtable *)(ulong)((int)caller + 1);
              pDVar13 = pDVar6;
            }
            else {
              *ppDVar19 = pDVar13;
              ppDVar19 = &pDVar13->next;
              pDVar13 = pDVar6;
            }
          }
          *ppDVar19 = (DdNode *)0x0;
        }
        pDVar17 = unique->subtableZ;
        uVar18 = (uint)caller;
        if (uVar18 != pDVar17[uVar16].dead) goto LAB_0066036f;
        pDVar17[uVar16].keys = pDVar17[uVar16].keys - uVar18;
        uVar15 = uVar15 + uVar18;
        pDVar17[uVar16].dead = 0;
      }
    }
    if (uVar15 == unique->deadZ) {
      unique->keysZ = unique->keysZ - uVar15;
      unique->deadZ = 0;
      pDVar13 = (DdNode *)0x0;
      pDVar6 = (DdNode *)unique->memoryList;
      while (pDVar20 = pDVar6, pDVar20 != (DdNode *)0x0) {
        pDVar6 = *(DdNode **)pDVar20;
        uVar18 = 0x20 - ((uint)pDVar20 & 0x1f) & 0xfffffff8;
        lVar12 = 0;
        do {
          if (*(int *)((long)&pDVar20->ref + lVar12 + (ulong)uVar18) == 0) {
            ppDVar22 = &pDVar13->next;
            bVar26 = pDVar13 == (DdNode *)0x0;
            pDVar13 = (DdNode *)((long)&pDVar20->index + lVar12 + (ulong)uVar18);
            if (bVar26) {
              ppDVar22 = &unique->nextFree;
            }
            *ppDVar22 = pDVar13;
          }
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0x9fb0);
      }
      pDVar13->next = (DdNode *)0x0;
      aVar11 = Extra_CpuTime();
      unique->GCTime = unique->GCTime + (aVar11 - aVar8);
      ppDVar25 = &unique->postGCHook;
      do {
        pDVar4 = *ppDVar25;
        if (pDVar4 == (DdHook *)0x0) {
          return uVar15 + uVar24;
        }
        iVar7 = (*pDVar4->f)(unique,"DD",(void *)0x0);
        ppDVar25 = &pDVar4->next;
      } while (iVar7 != 0);
      return 0;
    }
  }
LAB_00660377:
  ddReportRefMess(unique,-1,(char *)caller);
  caller = extraout_RDX_02;
LAB_00660382:
  ddReportRefMess(unique,0x7fffffff,(char *)caller);
  unique->maxCacheHard = unique->cacheSlots - 1;
  unique->cacheSlack = ~unique->cacheSlots;
  iVar7 = unique->size;
  lVar12 = 0x14;
  for (lVar14 = 0; lVar14 < iVar7; lVar14 = lVar14 + 1) {
    piVar2 = (int *)((long)&unique->subtables->nodelist + lVar12);
    *piVar2 = *piVar2 << 2;
    lVar12 = lVar12 + 0x38;
  }
  unique->gcFrac = 0.2;
  unique->minDead = (uint)(long)((double)unique->slots * 0.2);
  cuddShrinkDeathRow(unique);
  fwrite("Slowing down table growth: ",0x1b,1,(FILE *)unique->err);
  fprintf((FILE *)unique->err,"GC fraction = %.2f\t",unique->gcFrac);
  iVar7 = fprintf((FILE *)unique->err,"minDead = %u\n",(ulong)unique->minDead);
  return iVar7;
LAB_0066036f:
  ddReportRefMess(unique,(int)uVar16,(char *)caller);
  caller = extraout_RDX_01;
  goto LAB_00660377;
}

Assistant:

int
cuddGarbageCollect(
  DdManager * unique,
  int  clearCache)
{
    DdHook      *hook;
    DdCache     *cache = unique->cache;
    DdNode      *sentinel = &(unique->sentinel);
    DdNodePtr   *nodelist;
    int         i, j, deleted, totalDeleted, totalDeletedZ;
    DdCache     *c;
    DdNode      *node,*next;
    DdNodePtr   *lastP;
    int         slots;
    long        localTime;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    DdNodePtr   tree;
#else
    DdNodePtr *memListTrav, *nxtNode;
    DdNode *downTrav, *sentry;
    int k;
#endif
#endif

#ifndef DD_NO_DEATH_ROW
    cuddClearDeathRow(unique);
#endif

    hook = unique->preGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

    if (unique->dead + unique->deadZ == 0) {
        hook = unique->postGCHook;
        while (hook != NULL) {
            int res = (hook->f)(unique,"DD",NULL);
            if (res == 0) return(0);
            hook = hook->next;
        }
        return(0);
    }

    /* If many nodes are being reclaimed, we want to resize the tables
    ** more aggressively, to reduce the frequency of garbage collection.
    */
    if (clearCache && unique->gcFrac == DD_GC_FRAC_LO &&
        unique->slots <= unique->looseUpTo && unique->stash != NULL) {
        unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_HI);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        unique->gcFrac = DD_GC_FRAC_HI;
        return(0);
    }

    localTime = util_cpu_time();

    unique->garbageCollections++;
#ifdef DD_VERBOSE
    (void) fprintf(unique->err,
                   "garbage collecting (%d dead BDD nodes out of %d, min %d)...",
                   unique->dead, unique->keys, unique->minDead);
    (void) fprintf(unique->err,
                   "                   (%d dead ZDD nodes out of %d)...",
                   unique->deadZ, unique->keysZ);
#endif

    /* Remove references to garbage collected nodes from the cache. */
    if (clearCache) {
        slots = unique->cacheSlots;
        for (i = 0; i < slots; i++) {
            c = &cache[i];
            if (c->data != NULL) {
                if (cuddClean(c->f)->ref == 0 ||
                cuddClean(c->g)->ref == 0 ||
                (((ptruint)c->f & 0x2) && Cudd_Regular(c->h)->ref == 0) ||
                (c->data != DD_NON_CONSTANT &&
                Cudd_Regular(c->data)->ref == 0)) {
                    c->data = NULL;
                    unique->cachedeletions++;
                }
            }
        }
        cuddLocalCacheClearDead(unique);
    }

    /* Now return dead nodes to free list. Count them for sanity check. */
    totalDeleted = 0;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    tree = NULL;
#endif
#endif

    for (i = 0; i < unique->size; i++) {
        if (unique->subtables[i].dead == 0) continue;
        nodelist = unique->subtables[i].nodelist;

        deleted = 0;
        slots = unique->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != sentinel) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = sentinel;
        }
        if ((unsigned) deleted != unique->subtables[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->subtables[i].keys -= deleted;
        unique->subtables[i].dead = 0;
    }
    if (unique->constants.dead != 0) {
        nodelist = unique->constants.nodelist;
        deleted = 0;
        slots = unique->constants.slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->constants.dead) {
            ddReportRefMess(unique, CUDD_CONST_INDEX, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->constants.keys -= deleted;
        unique->constants.dead = 0;
    }
    if ((unsigned) totalDeleted != unique->dead) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keys -= totalDeleted;
    unique->dead = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeleted;
#endif

    totalDeletedZ = 0;

    for (i = 0; i < unique->sizeZ; i++) {
        if (unique->subtableZ[i].dead == 0) continue;
        nodelist = unique->subtableZ[i].nodelist;

        deleted = 0;
        slots = unique->subtableZ[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->subtableZ[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeletedZ += deleted;
        unique->subtableZ[i].keys -= deleted;
        unique->subtableZ[i].dead = 0;
    }

    /* No need to examine the constant table for ZDDs.
    ** If we did we should be careful not to count whatever dead
    ** nodes we found there among the dead ZDD nodes. */
    if ((unsigned) totalDeletedZ != unique->deadZ) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keysZ -= totalDeletedZ;
    unique->deadZ = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeletedZ;
#endif


#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    unique->nextFree = cuddOrderedThread(tree,unique->nextFree);
#else
    memListTrav = unique->memoryList;
    sentry = NULL;
    while (memListTrav != NULL) {
        ptruint offset;
        nxtNode = (DdNodePtr *)memListTrav[0];
//        offset = (ptruint) memListTrav & (sizeof(DdNode) - 1);
//        memListTrav += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
        offset = (ptruint) memListTrav & (32 - 1);
        memListTrav += (32 - offset) / sizeof(DdNodePtr);

        downTrav = (DdNode *)memListTrav;
        k = 0;
        do {
            if (downTrav[k].ref == 0) {
                if (sentry == NULL) {
                    unique->nextFree = sentry = &downTrav[k];
                } else {
                    /* First hook sentry->next to the dead node and then
                    ** reassign sentry to the dead node. */
                    sentry = (sentry->next = &downTrav[k]);
                }
            }
        } while (++k < DD_MEM_CHUNK);
        memListTrav = nxtNode;
    }
    sentry->next = NULL;
#endif
#endif

    unique->GCTime += util_cpu_time() - localTime;

    hook = unique->postGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

#ifdef DD_VERBOSE
    (void) fprintf(unique->err," done\n");
#endif

    return(totalDeleted+totalDeletedZ);

}